

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O2

void precalc(GameBoard *gameBoard,int *myele,int *enemyele,int *enemyht)

{
  int *piVar1;
  pointer pTVar2;
  int iVar3;
  Tetris *loc;
  pointer pTVar4;
  Tetris *loc_1;
  pointer pTVar5;
  int ele;
  int ht;
  int *local_118;
  int *local_110;
  vector<Tetris,_std::allocator<Tetris>_> enemyloc;
  vector<Tetris,_std::allocator<Tetris>_> myloc;
  Block local_c8;
  Board brd;
  
  myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118 = enemyele;
  GameBoard::getPlaces(gameBoard,gameBoard->currBotColor,gameBoard->currBlockType,&myloc,true);
  enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  GameBoard::getPlaces(gameBoard,gameBoard->enemyColor,gameBoard->enemyType,&enemyloc,true);
  pTVar5 = myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  *myele = 0;
  *local_118 = 0;
  *enemyht = 0x14;
  local_110 = enemyht;
  for (pTVar4 = myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 = enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
               super__Vector_impl_data._M_finish, piVar1 = local_110, pTVar4 != pTVar5;
      pTVar4 = pTVar4 + 1) {
    Board::Board(&brd,gameBoard->currBotColor,gameBoard);
    Block::Block(&local_c8,*pTVar4);
    eval(&brd,&local_c8,&ele,&ht);
    iVar3 = ele;
    if (ele < *myele) {
      iVar3 = *myele;
    }
    *myele = iVar3;
  }
  for (pTVar5 = enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar5 != pTVar2; pTVar5 = pTVar5 + 1) {
    Board::Board(&brd,gameBoard->enemyColor,gameBoard);
    Block::Block(&local_c8,*pTVar5);
    eval(&brd,&local_c8,&ele,&ht);
    iVar3 = ele;
    if (ele < *local_118) {
      iVar3 = *local_118;
    }
    *local_118 = iVar3;
    iVar3 = *piVar1;
    if (ht < iVar3) {
      iVar3 = ht;
    }
    *piVar1 = iVar3;
  }
  std::_Vector_base<Tetris,_std::allocator<Tetris>_>::~_Vector_base
            (&enemyloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>);
  std::_Vector_base<Tetris,_std::allocator<Tetris>_>::~_Vector_base
            (&myloc.super__Vector_base<Tetris,_std::allocator<Tetris>_>);
  return;
}

Assistant:

void precalc(GameBoard& gameBoard, int& myele, int& enemyele, int& enemyht) {
    std::vector<Tetris> myloc;
    gameBoard.getPlaces(gameBoard.currBotColor, gameBoard.currBlockType, myloc);
    std::vector<Tetris> enemyloc;
    gameBoard.getPlaces(gameBoard.enemyColor, gameBoard.enemyType, enemyloc);
    myele = 0;
    enemyele = 0;
    enemyht = 20;
    for (auto& loc : myloc) {
        int ht, ele;
        Board brd = Board(gameBoard.currBotColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        myele = std::max(myele, ele);
    }
    for (auto& loc : enemyloc) {
        int ht, ele;
        Board brd = Board(gameBoard.enemyColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        enemyele = std::max(enemyele, ele);
        enemyht = std::min(enemyht, ht);
    }
}